

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O3

void notify_free_handler_and_close_stream(cio_http_client *client)

{
  cio_http_location_handler *pcVar1;
  void *pvVar2;
  cio_error cVar3;
  
  pcVar1 = client->current_handler;
  if (pcVar1 != (cio_http_location_handler *)0x0) {
    (*pcVar1->free)(pcVar1);
    client->current_handler = (cio_http_location_handler *)0x0;
  }
  cVar3 = cio_buffered_stream_close(&client->buffered_stream);
  if (cVar3 == CIO_SUCCESS) {
    return;
  }
  pvVar2 = (client->parser).data;
  if (*(code **)((long)pvVar2 + 0xa8) != (code *)0x0) {
    (**(code **)((long)pvVar2 + 0xa8))(pvVar2,"closing buffered stream of client failed");
  }
  (**(code **)((long)pvVar2 + 0x88))(&client->socket);
  return;
}

Assistant:

static void notify_free_handler_and_close_stream(struct cio_http_client *client)
{
	free_handler(client);
	close_bs(client);
}